

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_progress.c
# Opt level: O3

int zip_register_progress_callback_with_state
              (zip_t *za,double precision,zip_progress_callback callback,
              _func_void_void_ptr *ud_free,void *ud)

{
  zip_progress_t *progress;
  
  progress = za->progress;
  if (callback == (zip_progress_callback)0x0) {
    if (progress != (zip_progress_t *)0x0) {
      if (progress->callback_cancel == (zip_cancel_callback)0x0) {
        _zip_progress_free(progress);
        za->progress = (zip_progress_t *)0x0;
      }
      else {
        if (progress->ud_progress_free != (_func_void_void_ptr *)0x0) {
          (*progress->ud_progress_free)(progress->ud_progress);
        }
        progress->callback_progress = (zip_progress_callback)0x0;
        progress->ud_progress_free = (_func_void_void_ptr *)0x0;
        progress->ud_progress = (void *)0x0;
      }
    }
  }
  else {
    if (progress == (zip_progress_t *)0x0) {
      progress = _zip_progress_new(za);
      za->progress = progress;
      if (progress == (zip_progress_t *)0x0) {
        return -1;
      }
    }
    if (progress->ud_progress_free != (_func_void_void_ptr *)0x0) {
      (*progress->ud_progress_free)(progress->ud_progress);
    }
    progress->callback_progress = callback;
    progress->ud_progress_free = ud_free;
    progress->ud_progress = ud;
    progress->precision = precision;
  }
  return 0;
}

Assistant:

ZIP_EXTERN int
zip_register_progress_callback_with_state(zip_t *za, double precision, zip_progress_callback callback, void (*ud_free)(void *), void *ud) {
    if (callback != NULL) {
        if (za->progress == NULL) {
            if ((za->progress = _zip_progress_new(za)) == NULL) {
                return -1;
            }
        }

        _zip_progress_set_progress_callback(za->progress, precision, callback, ud_free, ud);
    }
    else {
        if (za->progress != NULL) {
            if (za->progress->callback_cancel == NULL) {
                _zip_progress_free(za->progress);
                za->progress = NULL;
            }
            else {
                _zip_progress_free_progress_callback(za->progress);
            }
        }
    }

    return 0;
}